

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O2

void aom_quantize_b_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  long lVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  int i;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  __m128i *qcoeff1;
  __m128i *qcoeff0;
  undefined4 uVar17;
  undefined6 uVar19;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ushort uVar36;
  undefined4 uVar37;
  undefined1 auVar40 [12];
  ushort uVar45;
  ushort uVar47;
  ushort uVar49;
  ushort uVar51;
  ushort uVar53;
  ushort uVar55;
  ushort uVar57;
  undefined1 auVar41 [16];
  short sVar48;
  short sVar50;
  short sVar52;
  ushort uVar54;
  ushort uVar56;
  ushort uVar58;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined2 uVar71;
  undefined2 uVar72;
  undefined2 uVar73;
  undefined2 uVar74;
  undefined1 auVar59 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined2 uVar104;
  undefined2 uVar105;
  undefined2 uVar106;
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined2 uVar107;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  __m128i mask;
  __m128i mask_00;
  int is_found0;
  uint local_14c;
  ushort local_148;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_140;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  __m128i local_f8;
  undefined1 local_e8 [16];
  ushort local_d8;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  ushort local_c8;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  int thresh [4];
  undefined1 local_a8 [4];
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_a0;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  undefined1 local_98 [4];
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  undefined1 local_88 [16];
  __m128i mask0;
  __m128i threshold [2];
  undefined6 uVar18;
  undefined8 uVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar29 [16];
  short sVar30;
  undefined8 uVar38;
  undefined1 auVar39 [12];
  undefined1 auVar44 [16];
  short sVar46;
  undefined1 auVar66 [16];
  undefined1 auVar60 [16];
  undefined1 auVar67 [16];
  undefined1 auVar61 [16];
  undefined1 auVar68 [16];
  undefined1 auVar62 [16];
  undefined1 auVar69 [16];
  undefined1 auVar63 [16];
  undefined1 auVar70 [16];
  undefined1 auVar84 [16];
  undefined1 auVar99 [16];
  undefined1 auVar85 [16];
  undefined1 auVar100 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar86 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar101 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar87 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar102 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar88 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar103 [16];
  
  is_found0 = 0;
  mask0[0] = 0;
  mask0[1] = 0;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    thresh[lVar13] = (dequant_ptr[lVar13] * 0x145 + 0x40 >> 7) + zbin_ptr[lVar13] * 0x20 + -1;
  }
  thresh[3] = thresh[1];
  thresh[2] = thresh[1];
  auVar8._4_4_ = thresh[1];
  auVar8._0_4_ = thresh[1];
  auVar8._8_4_ = thresh[1];
  local_f8[0] = auVar8._4_8_;
  local_f8[1]._0_4_ = thresh[1];
  local_f8[1]._4_4_ = thresh[1];
  uVar20 = *(undefined8 *)round_ptr;
  uVar38 = *(undefined8 *)(round_ptr + 4);
  local_c8 = (ushort)uVar20;
  uStack_c6 = (ushort)((ulong)uVar20 >> 0x10);
  uStack_c4 = (ushort)((ulong)uVar20 >> 0x20);
  uStack_c2 = (ushort)((ulong)uVar20 >> 0x30);
  uStack_c0 = (ushort)uVar38;
  uStack_be = (ushort)((ulong)uVar38 >> 0x10);
  uStack_bc = (ushort)((ulong)uVar38 >> 0x20);
  uStack_ba = (ushort)((ulong)uVar38 >> 0x30);
  local_88._2_2_ = zbin_ptr[1] + -1;
  local_88._0_2_ = *zbin_ptr + -1;
  local_88._4_2_ = zbin_ptr[2] + -1;
  local_88._6_2_ = zbin_ptr[3] + -1;
  local_88._8_2_ = zbin_ptr[4] + -1;
  local_88._10_2_ = zbin_ptr[5] + -1;
  local_88._12_2_ = zbin_ptr[6] + -1;
  local_88._14_2_ = zbin_ptr[7] + -1;
  uVar20 = *(undefined8 *)quant_ptr;
  uVar38 = *(undefined8 *)(quant_ptr + 4);
  local_d8 = (ushort)uVar20;
  uStack_d6 = (ushort)((ulong)uVar20 >> 0x10);
  uStack_d4 = (ushort)((ulong)uVar20 >> 0x20);
  uStack_d2 = (ushort)((ulong)uVar20 >> 0x30);
  uStack_d0 = (ushort)uVar38;
  uStack_ce = (ushort)((ulong)uVar38 >> 0x10);
  uStack_cc = (ushort)((ulong)uVar38 >> 0x20);
  uStack_ca = (ushort)((ulong)uVar38 >> 0x30);
  uVar20 = *(undefined8 *)dequant_ptr;
  uVar38 = *(undefined8 *)(dequant_ptr + 4);
  local_148 = (ushort)uVar20;
  uStack_146 = (ushort)((ulong)uVar20 >> 0x10);
  uStack_144 = (ushort)((ulong)uVar20 >> 0x20);
  uStack_142 = (ushort)((ulong)uVar20 >> 0x30);
  uStack_140 = (ushort)uVar38;
  uStack_13e = (ushort)((ulong)uVar38 >> 0x10);
  uStack_13c = (ushort)((ulong)uVar38 >> 0x20);
  uStack_13a = (ushort)((ulong)uVar38 >> 0x30);
  local_138 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  local_128 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc)
                      );
  local_e8 = *(undefined1 (*) [16])quant_shift_ptr;
  sVar30 = local_138._0_2_;
  sVar33 = -sVar30;
  sVar31 = local_138._2_2_;
  auVar21._10_2_ = -sVar31;
  sVar32 = local_138._4_2_;
  auVar23._12_2_ = -sVar32;
  sVar46 = local_138._6_2_;
  auVar23._14_2_ = -sVar46;
  sVar48 = local_138._8_2_;
  sVar52 = -sVar48;
  sVar50 = local_138._10_2_;
  auVar39._10_2_ = -sVar50;
  sVar34 = local_138._12_2_;
  auVar24._12_2_ = -sVar34;
  sVar35 = local_138._14_2_;
  auVar24._14_2_ = -sVar35;
  local_108._0_2_ = (ushort)(sVar33 < sVar30) * sVar30 | (ushort)(sVar33 >= sVar30) * sVar33;
  local_108._2_2_ =
       (ushort)(auVar21._10_2_ < sVar31) * sVar31 |
       (ushort)(auVar21._10_2_ >= sVar31) * auVar21._10_2_;
  local_108._4_2_ =
       (ushort)(auVar23._12_2_ < sVar32) * sVar32 |
       (ushort)(auVar23._12_2_ >= sVar32) * auVar23._12_2_;
  local_108._6_2_ =
       (ushort)(auVar23._14_2_ < sVar46) * sVar46 |
       (ushort)(auVar23._14_2_ >= sVar46) * auVar23._14_2_;
  local_108._8_2_ = (ushort)(sVar52 < sVar48) * sVar48 | (ushort)(sVar52 >= sVar48) * sVar52;
  local_108._10_2_ =
       (ushort)(auVar39._10_2_ < sVar50) * sVar50 |
       (ushort)(auVar39._10_2_ >= sVar50) * auVar39._10_2_;
  local_108._12_2_ =
       (ushort)(auVar24._12_2_ < sVar34) * sVar34 |
       (ushort)(auVar24._12_2_ >= sVar34) * auVar24._12_2_;
  local_108._14_2_ =
       (ushort)(auVar24._14_2_ < sVar35) * sVar35 |
       (ushort)(auVar24._14_2_ >= sVar35) * auVar24._14_2_;
  qcoeff0 = (__m128i *)local_98;
  local_98._2_2_ = local_108._2_2_;
  local_98._0_2_ = local_108._0_2_;
  uStack_94 = local_108._4_2_;
  uStack_92 = local_108._6_2_;
  uStack_90 = local_108._8_2_;
  uStack_8e = local_108._10_2_;
  uStack_8c = local_108._12_2_;
  uStack_8a = local_108._14_2_;
  sVar30 = local_128._0_2_;
  sVar33 = -sVar30;
  sVar31 = local_128._2_2_;
  auVar21._10_2_ = -sVar31;
  sVar32 = local_128._4_2_;
  auVar23._12_2_ = -sVar32;
  sVar46 = local_128._6_2_;
  auVar23._14_2_ = -sVar46;
  sVar48 = local_128._8_2_;
  sVar52 = -sVar48;
  sVar50 = local_128._10_2_;
  auVar39._10_2_ = -sVar50;
  sVar34 = local_128._12_2_;
  auVar24._12_2_ = -sVar34;
  sVar35 = local_128._14_2_;
  auVar24._14_2_ = -sVar35;
  local_118._0_2_ = (ushort)(sVar33 < sVar30) * sVar30 | (ushort)(sVar33 >= sVar30) * sVar33;
  local_118._2_2_ =
       (ushort)(auVar21._10_2_ < sVar31) * sVar31 |
       (ushort)(auVar21._10_2_ >= sVar31) * auVar21._10_2_;
  local_118._4_2_ =
       (ushort)(auVar23._12_2_ < sVar32) * sVar32 |
       (ushort)(auVar23._12_2_ >= sVar32) * auVar23._12_2_;
  local_118._6_2_ =
       (ushort)(auVar23._14_2_ < sVar46) * sVar46 |
       (ushort)(auVar23._14_2_ >= sVar46) * auVar23._14_2_;
  local_118._8_2_ = (ushort)(sVar52 < sVar48) * sVar48 | (ushort)(sVar52 >= sVar48) * sVar52;
  local_118._10_2_ =
       (ushort)(auVar39._10_2_ < sVar50) * sVar50 |
       (ushort)(auVar39._10_2_ >= sVar50) * auVar39._10_2_;
  local_118._12_2_ =
       (ushort)(auVar24._12_2_ < sVar34) * sVar34 |
       (ushort)(auVar24._12_2_ >= sVar34) * auVar24._12_2_;
  local_118._14_2_ =
       (ushort)(auVar24._14_2_ < sVar35) * sVar35 |
       (ushort)(auVar24._14_2_ >= sVar35) * auVar24._14_2_;
  qcoeff1 = (__m128i *)local_a8;
  local_a8._2_2_ = local_118._2_2_;
  local_a8._0_2_ = local_118._0_2_;
  uStack_a4 = local_118._4_2_;
  uStack_a2 = local_118._6_2_;
  uStack_a0 = local_118._8_2_;
  uStack_9e = local_118._10_2_;
  uStack_9c = local_118._12_2_;
  uStack_9a = local_118._14_2_;
  threshold[1] = local_f8;
  update_mask0(qcoeff0,qcoeff1,threshold,iscan,&is_found0,&mask0);
  auVar26._0_2_ = -(ushort)(local_88._0_2_ < local_108._0_2_);
  auVar26._2_2_ = -(ushort)(local_88._2_2_ < local_108._2_2_);
  auVar26._4_2_ = -(ushort)(local_88._4_2_ < local_108._4_2_);
  auVar26._6_2_ = -(ushort)(local_88._6_2_ < local_108._6_2_);
  sVar33 = local_88._8_2_;
  auVar26._8_2_ = -(ushort)(sVar33 < local_108._8_2_);
  auVar21._10_2_ = local_88._10_2_;
  auVar26._10_2_ = -(ushort)(auVar21._10_2_ < local_108._10_2_);
  auVar23._12_2_ = local_88._12_2_;
  auVar26._12_2_ = -(ushort)(auVar23._12_2_ < local_108._12_2_);
  auVar23._14_2_ = local_88._14_2_;
  auVar26._14_2_ = -(ushort)(auVar23._14_2_ < local_108._14_2_);
  local_88._0_8_ = local_88._8_8_;
  auVar111._0_2_ = -(ushort)(sVar33 < local_118._0_2_);
  auVar111._2_2_ = -(ushort)(auVar21._10_2_ < local_118._2_2_);
  auVar111._4_2_ = -(ushort)(auVar23._12_2_ < local_118._4_2_);
  auVar111._6_2_ = -(ushort)(auVar23._14_2_ < local_118._6_2_);
  auVar111._8_2_ = -(ushort)(sVar33 < local_118._8_2_);
  auVar111._10_2_ = -(ushort)(auVar21._10_2_ < local_118._10_2_);
  auVar111._12_2_ = -(ushort)(auVar23._12_2_ < local_118._12_2_);
  auVar111._14_2_ = -(ushort)(auVar23._14_2_ < local_118._14_2_);
  auVar23 = auVar111 | auVar26;
  uVar45 = (ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
           (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
           (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
           (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
           (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
           (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
           (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
           (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
           (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
           (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
           (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
           (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
           (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar23[0xf] >> 7) << 0xf
  ;
  local_14c = (uint)CONCAT11((char)(uVar45 >> 8),uVar45 == 0);
  if (uVar45 == 0) {
    qcoeff_ptr[0xc] = 0;
    qcoeff_ptr[0xd] = 0;
    qcoeff_ptr[0xe] = 0;
    qcoeff_ptr[0xf] = 0;
    qcoeff_ptr[8] = 0;
    qcoeff_ptr[9] = 0;
    qcoeff_ptr[10] = 0;
    qcoeff_ptr[0xb] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    local_108._4_4_ = CONCAT22(uStack_c2,uStack_c4);
    local_108._0_4_ = CONCAT22(uStack_be,uStack_c0);
    local_108._8_4_ = CONCAT22(uStack_be,uStack_c0);
    local_108._12_4_ = CONCAT22(uStack_c2,uStack_c4);
    local_118._4_4_ = CONCAT22(uStack_d2,uStack_d4);
    local_118._0_4_ = CONCAT22(uStack_ce,uStack_d0);
    local_118._8_4_ = CONCAT22(uStack_ce,uStack_d0);
    local_118._12_4_ = CONCAT22(uStack_d2,uStack_d4);
    local_128._4_4_ = local_e8._4_4_;
    local_128._0_4_ = local_e8._8_4_;
    local_128._8_4_ = local_e8._8_4_;
    local_128._12_4_ = local_e8._4_4_;
    local_138._4_4_ = CONCAT22(uStack_142,uStack_144);
    local_138._0_4_ = CONCAT22(uStack_13e,uStack_140);
    local_138._8_4_ = CONCAT22(uStack_13e,uStack_140);
    local_138._12_4_ = CONCAT22(uStack_142,uStack_144);
    sVar33 = 0;
    uVar71 = 0;
    auVar21._10_2_ = 0;
    uVar72 = 0;
    auVar23._12_2_ = 0;
    uVar73 = 0;
    auVar23._14_2_ = 0;
    uVar74 = 0;
    auVar109 = (undefined1  [16])0x0;
    sVar52 = 0;
    uVar104 = 0;
    auVar39._10_2_ = 0;
    uVar105 = 0;
    auVar24._12_2_ = 0;
    uVar106 = 0;
    auVar24._14_2_ = 0;
    uVar107 = 0;
    uVar36 = 0;
    uVar45 = 0;
    uVar47 = 0;
    uVar49 = 0;
    uVar51 = 0;
    uVar53 = 0;
    uVar55 = 0;
    uVar57 = 0;
  }
  else {
    auVar110 = psraw(local_138,0xf);
    auVar109 = psraw(local_128,0xf);
    auVar24 = *(undefined1 (*) [16])iscan & auVar26;
    auVar23 = *(undefined1 (*) [16])(iscan + 8) & auVar111;
    sVar33 = auVar24._0_2_;
    auVar21._10_2_ = auVar23._0_2_;
    uVar36 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
             (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
    sVar33 = auVar24._2_2_;
    auVar21._10_2_ = auVar23._2_2_;
    uVar45 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
             (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
    sVar33 = auVar24._4_2_;
    auVar21._10_2_ = auVar23._4_2_;
    uVar47 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
             (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
    sVar33 = auVar24._6_2_;
    auVar21._10_2_ = auVar23._6_2_;
    uVar49 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
             (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
    sVar33 = auVar24._8_2_;
    auVar21._10_2_ = auVar23._8_2_;
    uVar51 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
             (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
    sVar33 = auVar24._10_2_;
    auVar21._10_2_ = auVar23._10_2_;
    uVar53 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
             (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
    sVar33 = auVar24._12_2_;
    auVar21._10_2_ = auVar23._12_2_;
    auVar23._12_2_ = auVar23._14_2_;
    uVar55 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
             (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
    sVar33 = auVar24._14_2_;
    uVar57 = (ushort)(auVar23._12_2_ < sVar33) * sVar33 |
             (ushort)(auVar23._12_2_ >= sVar33) * auVar23._12_2_;
    uVar36 = (0 < (short)uVar36) * uVar36;
    uVar45 = (0 < (short)uVar45) * uVar45;
    uVar47 = (0 < (short)uVar47) * uVar47;
    uVar49 = (0 < (short)uVar49) * uVar49;
    uVar51 = (0 < (short)uVar51) * uVar51;
    uVar53 = (0 < (short)uVar53) * uVar53;
    uVar55 = (0 < (short)uVar55) * uVar55;
    uVar57 = (0 < (short)uVar57) * uVar57;
    auVar6._2_2_ = uStack_c6;
    auVar6._0_2_ = local_c8;
    auVar6._4_2_ = uStack_c4;
    auVar6._6_2_ = uStack_c2;
    auVar6._8_2_ = uStack_c0;
    auVar6._10_2_ = uStack_be;
    auVar5._12_2_ = uStack_bc;
    auVar5._0_12_ = auVar6;
    auVar5._14_2_ = uStack_ba;
    auVar24 = paddsw(local_108,auVar5);
    auVar3._2_2_ = uStack_d6;
    auVar3._0_2_ = local_d8;
    auVar3._4_2_ = uStack_d4;
    auVar3._6_2_ = uStack_d2;
    auVar3._8_2_ = uStack_d0;
    auVar3._10_2_ = uStack_ce;
    auVar112._12_2_ = uStack_cc;
    auVar112._0_12_ = auVar3;
    auVar112._14_2_ = uStack_ca;
    auVar23 = pmulhw(auVar24,auVar112);
    auVar25._0_2_ = auVar23._0_2_ + auVar24._0_2_;
    auVar25._2_2_ = auVar23._2_2_ + auVar24._2_2_;
    auVar25._4_2_ = auVar23._4_2_ + auVar24._4_2_;
    auVar25._6_2_ = auVar23._6_2_ + auVar24._6_2_;
    auVar25._8_2_ = auVar23._8_2_ + auVar24._8_2_;
    auVar25._10_2_ = auVar23._10_2_ + auVar24._10_2_;
    auVar25._12_2_ = auVar23._12_2_ + auVar24._12_2_;
    auVar25._14_2_ = auVar23._14_2_ + auVar24._14_2_;
    auVar23 = pmulhw(auVar25,local_e8);
    local_108._8_4_ = auVar6._8_4_;
    local_108._12_4_ = auVar5._12_4_;
    local_108._0_8_ = auVar5._8_8_;
    auVar108._8_4_ = auVar3._8_4_;
    auVar108._12_4_ = auVar112._12_4_;
    auVar108._0_8_ = auVar112._8_8_;
    local_128._12_4_ = local_e8._12_4_;
    local_128._0_8_ = local_e8._8_8_;
    local_128._8_4_ = local_e8._8_4_;
    auVar112 = paddsw(local_118,local_108);
    auVar24 = pmulhw(auVar112,auVar108);
    auVar41._0_2_ = auVar24._0_2_ + auVar112._0_2_;
    auVar41._2_2_ = auVar24._2_2_ + auVar112._2_2_;
    auVar41._4_2_ = auVar24._4_2_ + auVar112._4_2_;
    auVar41._6_2_ = auVar24._6_2_ + auVar112._6_2_;
    auVar41._8_2_ = auVar24._8_2_ + auVar112._8_2_;
    auVar41._10_2_ = auVar24._10_2_ + auVar112._10_2_;
    auVar41._12_2_ = auVar24._12_2_ + auVar112._12_2_;
    auVar41._14_2_ = auVar24._14_2_ + auVar112._14_2_;
    _local_a8 = (__m128i)pmulhw(auVar41,local_128);
    auVar23 = auVar23 ^ auVar110;
    local_98._0_2_ = auVar23._0_2_ - auVar110._0_2_;
    local_98._2_2_ = auVar23._2_2_ - auVar110._2_2_;
    uStack_94 = auVar23._4_2_ - auVar110._4_2_;
    uStack_92 = auVar23._6_2_ - auVar110._6_2_;
    uStack_90 = auVar23._8_2_ - auVar110._8_2_;
    uStack_8e = auVar23._10_2_ - auVar110._10_2_;
    uStack_8c = auVar23._12_2_ - auVar110._12_2_;
    uStack_8a = auVar23._14_2_ - auVar110._14_2_;
    auVar23 = (undefined1  [16])_local_a8 ^ auVar109;
    auVar110._0_2_ = auVar23._0_2_ - auVar109._0_2_;
    auVar110._2_2_ = auVar23._2_2_ - auVar109._2_2_;
    auVar110._4_2_ = auVar23._4_2_ - auVar109._4_2_;
    auVar110._6_2_ = auVar23._6_2_ - auVar109._6_2_;
    auVar110._8_2_ = auVar23._8_2_ - auVar109._8_2_;
    auVar110._10_2_ = auVar23._10_2_ - auVar109._10_2_;
    auVar110._12_2_ = auVar23._12_2_ - auVar109._12_2_;
    auVar110._14_2_ = auVar23._14_2_ - auVar109._14_2_;
    auVar26 = (undefined1  [16])_local_98 & auVar26;
    auVar110 = auVar110 & auVar111;
    auVar23 = psraw(auVar26,0xf);
    auVar78._0_12_ = auVar26._0_12_;
    auVar78._12_2_ = auVar26._6_2_;
    auVar78._14_2_ = auVar23._6_2_;
    auVar77._12_4_ = auVar78._12_4_;
    auVar77._0_10_ = auVar26._0_10_;
    auVar77._10_2_ = auVar23._4_2_;
    auVar76._10_6_ = auVar77._10_6_;
    auVar76._0_8_ = auVar26._0_8_;
    auVar76._8_2_ = auVar26._4_2_;
    auVar75._8_8_ = auVar76._8_8_;
    auVar75._6_2_ = auVar23._2_2_;
    auVar75._4_2_ = auVar26._2_2_;
    auVar75._0_2_ = auVar26._0_2_;
    auVar75._2_2_ = auVar23._0_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar75;
    *(short *)(qcoeff_ptr + 4) = auVar26._8_2_;
    *(short *)((long)qcoeff_ptr + 0x12) = auVar23._8_2_;
    *(short *)(qcoeff_ptr + 5) = auVar26._10_2_;
    *(short *)((long)qcoeff_ptr + 0x16) = auVar23._10_2_;
    *(short *)(qcoeff_ptr + 6) = auVar26._12_2_;
    *(short *)((long)qcoeff_ptr + 0x1a) = auVar23._12_2_;
    *(short *)(qcoeff_ptr + 7) = auVar26._14_2_;
    *(short *)((long)qcoeff_ptr + 0x1e) = auVar23._14_2_;
    auVar23 = psraw(auVar110,0xf);
    auVar82._0_12_ = auVar110._0_12_;
    auVar82._12_2_ = auVar110._6_2_;
    auVar82._14_2_ = auVar23._6_2_;
    auVar81._12_4_ = auVar82._12_4_;
    auVar81._0_10_ = auVar110._0_10_;
    auVar81._10_2_ = auVar23._4_2_;
    auVar80._10_6_ = auVar81._10_6_;
    auVar80._0_8_ = auVar110._0_8_;
    auVar80._8_2_ = auVar110._4_2_;
    auVar79._8_8_ = auVar80._8_8_;
    auVar79._6_2_ = auVar23._2_2_;
    auVar79._4_2_ = auVar110._2_2_;
    auVar79._0_2_ = auVar110._0_2_;
    auVar79._2_2_ = auVar23._0_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar79;
    *(short *)(qcoeff_ptr + 0xc) = auVar110._8_2_;
    *(short *)((long)qcoeff_ptr + 0x32) = auVar23._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = auVar110._10_2_;
    *(short *)((long)qcoeff_ptr + 0x36) = auVar23._10_2_;
    *(short *)(qcoeff_ptr + 0xe) = auVar110._12_2_;
    *(short *)((long)qcoeff_ptr + 0x3a) = auVar23._12_2_;
    *(short *)(qcoeff_ptr + 0xf) = auVar110._14_2_;
    *(short *)((long)qcoeff_ptr + 0x3e) = auVar23._14_2_;
    uVar19 = CONCAT24(uStack_13e,CONCAT22(uStack_140,uStack_142));
    Var9 = CONCAT28(uStack_13a,CONCAT26(uStack_13c,uVar19));
    sVar30 = auVar26._2_2_ * uStack_146;
    uVar17 = CONCAT22(sVar30,auVar75._0_2_ * local_148);
    sVar31 = auVar26._4_2_ * uStack_144;
    uVar18 = CONCAT24(sVar31,uVar17);
    sVar32 = auVar26._6_2_ * uStack_142;
    uVar20 = CONCAT26(sVar32,uVar18);
    sVar33 = auVar26._8_2_ * uStack_140;
    auVar21._0_10_ = CONCAT28(sVar33,uVar20);
    auVar21._10_2_ = auVar26._10_2_ * uStack_13e;
    auVar23._12_2_ = auVar26._12_2_ * uStack_13c;
    auVar23._0_12_ = auVar21;
    auVar23._14_2_ = auVar26._14_2_ * uStack_13a;
    local_138._8_4_ = (undefined4)((uint6)uVar19 >> 0x10);
    local_138._12_4_ = (undefined4)((unkuint10)Var9 >> 0x30);
    local_138._0_8_ = (undefined8)((unkuint10)Var9 >> 0x10);
    sVar46 = auVar110._2_2_ * uStack_13e;
    uVar37 = CONCAT22(sVar46,auVar79._0_2_ * uStack_140);
    sVar48 = auVar110._4_2_ * uStack_13c;
    uVar19 = CONCAT24(sVar48,uVar37);
    sVar50 = auVar110._6_2_ * uStack_13a;
    uVar38 = CONCAT26(sVar50,uVar19);
    sVar52 = auVar110._8_2_ * uStack_140;
    auVar39._0_10_ = CONCAT28(sVar52,uVar38);
    auVar39._10_2_ = auVar110._10_2_ * uStack_13e;
    auVar24._12_2_ = auVar110._12_2_ * uStack_13c;
    auVar24._0_12_ = auVar39;
    auVar24._14_2_ = auVar110._14_2_ * uStack_13a;
    auVar26 = psraw(auVar23,0xf);
    auVar88._12_2_ = sVar32;
    auVar88._0_12_ = auVar21;
    auVar88._14_2_ = auVar26._6_2_;
    auVar87._12_4_ = auVar88._12_4_;
    auVar87._10_2_ = auVar26._4_2_;
    auVar87._0_10_ = auVar21._0_10_;
    auVar86._10_6_ = auVar87._10_6_;
    auVar86._8_2_ = sVar31;
    auVar86._0_8_ = uVar20;
    auVar85._8_8_ = auVar86._8_8_;
    auVar85._6_2_ = auVar26._2_2_;
    auVar85._0_6_ = uVar18;
    auVar84._6_10_ = auVar85._6_10_;
    auVar84._4_2_ = sVar30;
    auVar84._0_4_ = uVar17;
    auVar83._4_12_ = auVar84._4_12_;
    auVar83._2_2_ = auVar26._0_2_;
    auVar83._0_2_ = auVar75._0_2_ * local_148;
    uVar71 = auVar26._8_2_;
    uVar72 = auVar26._10_2_;
    uVar73 = auVar26._12_2_;
    uVar74 = auVar26._14_2_;
    *(undefined1 (*) [16])dqcoeff_ptr = auVar83;
    auVar26 = psraw(auVar24,0xf);
    auVar63._12_2_ = sVar50;
    auVar63._0_12_ = auVar39;
    auVar63._14_2_ = auVar26._6_2_;
    auVar62._12_4_ = auVar63._12_4_;
    auVar62._10_2_ = auVar26._4_2_;
    auVar62._0_10_ = auVar39._0_10_;
    auVar61._10_6_ = auVar62._10_6_;
    auVar61._8_2_ = sVar48;
    auVar61._0_8_ = uVar38;
    auVar60._8_8_ = auVar61._8_8_;
    auVar60._6_2_ = auVar26._2_2_;
    auVar60._0_6_ = uVar19;
    auVar59._6_10_ = auVar60._6_10_;
    auVar59._4_2_ = sVar46;
    auVar59._0_4_ = uVar37;
    auVar109._4_12_ = auVar59._4_12_;
    auVar109._2_2_ = auVar26._0_2_;
    auVar109._0_2_ = auVar79._0_2_ * uStack_140;
    uVar104 = auVar26._8_2_;
    uVar105 = auVar26._10_2_;
    uVar106 = auVar26._12_2_;
    uVar107 = auVar26._14_2_;
    local_118 = auVar108;
  }
  threshold[0][0] = local_f8[0];
  threshold[0][1] = local_f8[1];
  *(short *)(dqcoeff_ptr + 4) = sVar33;
  *(undefined2 *)((long)dqcoeff_ptr + 0x12) = uVar71;
  *(short *)(dqcoeff_ptr + 5) = auVar21._10_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x16) = uVar72;
  *(short *)(dqcoeff_ptr + 6) = auVar23._12_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x1a) = uVar73;
  *(short *)(dqcoeff_ptr + 7) = auVar23._14_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x1e) = uVar74;
  *(undefined1 (*) [16])(dqcoeff_ptr + 8) = auVar109;
  *(short *)(dqcoeff_ptr + 0xc) = sVar52;
  *(undefined2 *)((long)dqcoeff_ptr + 0x32) = uVar104;
  *(short *)(dqcoeff_ptr + 0xd) = auVar39._10_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x36) = uVar105;
  *(short *)(dqcoeff_ptr + 0xe) = auVar24._12_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x3a) = uVar106;
  *(short *)(dqcoeff_ptr + 0xf) = auVar24._14_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x3e) = uVar107;
  lVar13 = 0x10;
LAB_002bf984:
  lVar16 = (long)(int)lVar13 * 2;
  lVar2 = (long)(int)lVar13;
  while (lVar13 = lVar2 + 0x10, local_148 = uVar36, uStack_146 = uVar45, uStack_144 = uVar47,
        uStack_142 = uVar49, uStack_140 = uVar51, uStack_13e = uVar53, uStack_13c = uVar55,
        uStack_13a = uVar57, lVar2 < n_coeffs) {
    local_e8 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar2),
                        *(undefined1 (*) [16])(coeff_ptr + lVar2 + 4));
    local_f8 = (__m128i)packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar2 + 8),
                                 *(undefined1 (*) [16])(coeff_ptr + lVar2 + 0xc));
    sVar30 = local_e8._0_2_;
    sVar33 = -sVar30;
    sVar31 = local_e8._2_2_;
    auVar21._10_2_ = -sVar31;
    sVar32 = local_e8._4_2_;
    auVar23._12_2_ = -sVar32;
    sVar46 = local_e8._6_2_;
    auVar23._14_2_ = -sVar46;
    sVar48 = local_e8._8_2_;
    sVar52 = -sVar48;
    sVar50 = local_e8._10_2_;
    auVar39._10_2_ = -sVar50;
    sVar34 = local_e8._12_2_;
    auVar24._12_2_ = -sVar34;
    sVar35 = local_e8._14_2_;
    auVar24._14_2_ = -sVar35;
    local_c8 = (ushort)(sVar33 < sVar30) * sVar30 | (ushort)(sVar33 >= sVar30) * sVar33;
    uStack_c6 = (ushort)(auVar21._10_2_ < sVar31) * sVar31 |
                (ushort)(auVar21._10_2_ >= sVar31) * auVar21._10_2_;
    uStack_c4 = (ushort)(auVar23._12_2_ < sVar32) * sVar32 |
                (ushort)(auVar23._12_2_ >= sVar32) * auVar23._12_2_;
    uStack_c2 = (ushort)(auVar23._14_2_ < sVar46) * sVar46 |
                (ushort)(auVar23._14_2_ >= sVar46) * auVar23._14_2_;
    uStack_c0 = (ushort)(sVar52 < sVar48) * sVar48 | (ushort)(sVar52 >= sVar48) * sVar52;
    uStack_be = (ushort)(auVar39._10_2_ < sVar50) * sVar50 |
                (ushort)(auVar39._10_2_ >= sVar50) * auVar39._10_2_;
    uStack_bc = (ushort)(auVar24._12_2_ < sVar34) * sVar34 |
                (ushort)(auVar24._12_2_ >= sVar34) * auVar24._12_2_;
    uStack_ba = (ushort)(auVar24._14_2_ < sVar35) * sVar35 |
                (ushort)(auVar24._14_2_ >= sVar35) * auVar24._14_2_;
    local_98._2_2_ = uStack_c6;
    local_98._0_2_ = local_c8;
    uStack_94 = uStack_c4;
    uStack_92 = uStack_c2;
    uStack_90 = uStack_c0;
    uStack_8e = uStack_be;
    uStack_8c = uStack_bc;
    uStack_8a = uStack_ba;
    sVar30 = (short)local_f8[0];
    sVar33 = -sVar30;
    sVar31 = local_f8[0]._2_2_;
    auVar21._10_2_ = -sVar31;
    sVar32 = local_f8[0]._4_2_;
    auVar23._12_2_ = -sVar32;
    sVar46 = local_f8[0]._6_2_;
    auVar23._14_2_ = -sVar46;
    sVar48 = (short)local_f8[1];
    sVar52 = -sVar48;
    sVar50 = local_f8[1]._2_2_;
    auVar39._10_2_ = -sVar50;
    sVar34 = local_f8[1]._4_2_;
    auVar24._12_2_ = -sVar34;
    sVar35 = local_f8[1]._6_2_;
    auVar24._14_2_ = -sVar35;
    local_d8 = (ushort)(sVar33 < sVar30) * sVar30 | (ushort)(sVar33 >= sVar30) * sVar33;
    uStack_d6 = (ushort)(auVar21._10_2_ < sVar31) * sVar31 |
                (ushort)(auVar21._10_2_ >= sVar31) * auVar21._10_2_;
    uStack_d4 = (ushort)(auVar23._12_2_ < sVar32) * sVar32 |
                (ushort)(auVar23._12_2_ >= sVar32) * auVar23._12_2_;
    uStack_d2 = (ushort)(auVar23._14_2_ < sVar46) * sVar46 |
                (ushort)(auVar23._14_2_ >= sVar46) * auVar23._14_2_;
    uStack_d0 = (ushort)(sVar52 < sVar48) * sVar48 | (ushort)(sVar52 >= sVar48) * sVar52;
    uStack_ce = (ushort)(auVar39._10_2_ < sVar50) * sVar50 |
                (ushort)(auVar39._10_2_ >= sVar50) * auVar39._10_2_;
    uStack_cc = (ushort)(auVar24._12_2_ < sVar34) * sVar34 |
                (ushort)(auVar24._12_2_ >= sVar34) * auVar24._12_2_;
    uStack_ca = (ushort)(auVar24._14_2_ < sVar35) * sVar35 |
                (ushort)(auVar24._14_2_ >= sVar35) * auVar24._14_2_;
    local_a8._2_2_ = uStack_d6;
    local_a8._0_2_ = local_d8;
    uStack_a4 = uStack_d4;
    uStack_a2 = uStack_d2;
    uStack_a0 = uStack_d0;
    uStack_9e = uStack_ce;
    uStack_9c = uStack_cc;
    uStack_9a = uStack_ca;
    qcoeff0 = (__m128i *)local_98;
    qcoeff1 = (__m128i *)local_a8;
    update_mask0(qcoeff0,qcoeff1,threshold,(int16_t *)((long)iscan + lVar16),&is_found0,&mask0);
    auVar7._2_2_ = uStack_c6;
    auVar7._0_2_ = local_c8;
    auVar7._4_2_ = uStack_c4;
    auVar7._6_2_ = uStack_c2;
    auVar7._8_2_ = uStack_c0;
    auVar7._10_2_ = uStack_be;
    auVar7._12_2_ = uStack_bc;
    auVar7._14_2_ = uStack_ba;
    auVar4._2_2_ = uStack_d6;
    auVar4._0_2_ = local_d8;
    auVar4._4_2_ = uStack_d4;
    auVar4._6_2_ = uStack_d2;
    auVar4._8_2_ = uStack_d0;
    auVar4._10_2_ = uStack_ce;
    auVar4._12_2_ = uStack_cc;
    auVar4._14_2_ = uStack_ca;
    auVar89._0_2_ = -(ushort)((short)local_88._0_2_ < (short)local_c8);
    auVar89._2_2_ = -(ushort)((short)local_88._2_2_ < (short)uStack_c6);
    auVar89._4_2_ = -(ushort)((short)local_88._4_2_ < (short)uStack_c4);
    auVar89._6_2_ = -(ushort)((short)local_88._6_2_ < (short)uStack_c2);
    auVar89._8_2_ = -(ushort)((short)local_88._8_2_ < (short)uStack_c0);
    auVar89._10_2_ = -(ushort)((short)local_88._10_2_ < (short)uStack_be);
    auVar89._12_2_ = -(ushort)((short)local_88._12_2_ < (short)uStack_bc);
    auVar89._14_2_ = -(ushort)((short)local_88._14_2_ < (short)uStack_ba);
    auVar64._0_2_ = -(ushort)((short)local_88._0_2_ < (short)local_d8);
    auVar64._2_2_ = -(ushort)((short)local_88._2_2_ < (short)uStack_d6);
    auVar64._4_2_ = -(ushort)((short)local_88._4_2_ < (short)uStack_d4);
    auVar64._6_2_ = -(ushort)((short)local_88._6_2_ < (short)uStack_d2);
    auVar64._8_2_ = -(ushort)((short)local_88._8_2_ < (short)uStack_d0);
    auVar64._10_2_ = -(ushort)((short)local_88._10_2_ < (short)uStack_ce);
    auVar64._12_2_ = -(ushort)((short)local_88._12_2_ < (short)uStack_cc);
    auVar64._14_2_ = -(ushort)((short)local_88._14_2_ < (short)uStack_ca);
    auVar23 = auVar64 | auVar89;
    if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar23 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar23 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar23 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar23 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar23 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar23 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar23[0xf] < '\0')
    goto LAB_002bface;
    uVar36 = (-1 < (short)local_148) * local_148;
    uVar45 = (-1 < (short)uStack_146) * uStack_146;
    uVar47 = (-1 < (short)uStack_144) * uStack_144;
    uVar49 = (-1 < (short)uStack_142) * uStack_142;
    uVar51 = (-1 < (short)uStack_140) * uStack_140;
    uVar53 = (-1 < (short)uStack_13e) * uStack_13e;
    uVar55 = (-1 < (short)uStack_13c) * uStack_13c;
    uVar57 = (-1 < (short)uStack_13a) * uStack_13a;
    *(undefined1 (*) [16])(qcoeff_ptr + lVar2 + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + lVar2 + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + lVar2 + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + lVar2) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + lVar2 + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + lVar2 + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + lVar2 + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + lVar2) = (undefined1  [16])0x0;
    lVar16 = lVar16 + 0x20;
    lVar2 = lVar13;
  }
  if (is_found0 == 0) {
    uVar10 = 0;
  }
  else {
    mask[1] = (longlong)qcoeff1;
    mask[0] = (longlong)qcoeff0;
    uVar10 = calculate_non_zero_count(mask);
  }
  if ((local_14c & 1) == 0) {
    mask_00[1] = (longlong)qcoeff1;
    mask_00[0] = (longlong)qcoeff0;
    iVar11 = calculate_non_zero_count(mask_00);
    uVar12 = iVar11 - 1;
  }
  else {
    uVar12 = 0xffffffff;
  }
  for (; (int)uVar10 <= (int)uVar12; uVar12 = uVar12 - 1) {
    sVar33 = scan[uVar12];
    qcoeff_ptr[sVar33] = 0;
    dqcoeff_ptr[sVar33] = 0;
  }
  uVar12 = uVar10 + 1;
  uVar15 = (ulong)uVar10;
  do {
    if ((long)uVar15 < 1) {
      uVar12 = 0;
      break;
    }
    lVar13 = uVar15 - 1;
    uVar15 = uVar15 - 1;
    uVar12 = uVar12 - 1;
  } while (qcoeff_ptr[scan[lVar13]] == 0);
  *eob_ptr = (uint16_t)uVar12;
  uVar15 = 0;
  uVar14 = 0xffffffff;
  do {
    if (uVar10 == uVar15) {
LAB_002bfcc9:
      if (((uint16_t)uVar12 != 0) && (uVar14 == (uVar12 & 0xffff) - 1)) {
        sVar33 = scan[uVar14];
        if (((qcoeff_ptr[sVar33] == 1) || (qcoeff_ptr[sVar33] == -1)) &&
           (uVar10 = coeff_ptr[sVar33] >> 0x1f, uVar15 = (ulong)((uint)(sVar33 != 0) * 2),
           (int)((coeff_ptr[sVar33] << 5 ^ uVar10) - uVar10) <
           *(short *)((long)zbin_ptr + uVar15) * 0x20 +
           (*(short *)((long)dequant_ptr + uVar15) * 0x20d + 0x40 >> 7))) {
          qcoeff_ptr[sVar33] = 0;
          dqcoeff_ptr[sVar33] = 0;
          *eob_ptr = 0;
        }
      }
      return;
    }
    if (qcoeff_ptr[scan[uVar15]] != 0) {
      uVar14 = (uint)uVar15;
      goto LAB_002bfcc9;
    }
    uVar15 = uVar15 + 1;
  } while( true );
LAB_002bface:
  auVar24 = psraw(local_e8,0xf);
  auVar111 = psraw((undefined1  [16])local_f8,0xf);
  auVar26 = *(undefined1 (*) [16])(iscan + lVar2) & auVar89;
  auVar23 = *(undefined1 (*) [16])(iscan + lVar2 + 8) & auVar64;
  sVar33 = auVar26._0_2_;
  auVar21._10_2_ = auVar23._0_2_;
  uVar45 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
           (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
  sVar33 = auVar26._2_2_;
  auVar21._10_2_ = auVar23._2_2_;
  uVar57 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
           (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
  sVar33 = auVar26._4_2_;
  auVar21._10_2_ = auVar23._4_2_;
  uVar55 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
           (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
  sVar33 = auVar26._6_2_;
  auVar21._10_2_ = auVar23._6_2_;
  uVar53 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
           (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
  sVar33 = auVar26._8_2_;
  auVar21._10_2_ = auVar23._8_2_;
  uVar51 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
           (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
  sVar33 = auVar26._10_2_;
  auVar21._10_2_ = auVar23._10_2_;
  uVar54 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
           (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
  sVar33 = auVar26._12_2_;
  auVar21._10_2_ = auVar23._12_2_;
  auVar23._12_2_ = auVar23._14_2_;
  uVar56 = (ushort)(auVar21._10_2_ < sVar33) * sVar33 |
           (ushort)(auVar21._10_2_ >= sVar33) * auVar21._10_2_;
  sVar33 = auVar26._14_2_;
  uVar58 = (ushort)(auVar23._12_2_ < sVar33) * sVar33 |
           (ushort)(auVar23._12_2_ >= sVar33) * auVar23._12_2_;
  uVar36 = ((short)local_148 < (short)uVar45) * uVar45 |
           ((short)local_148 >= (short)uVar45) * local_148;
  uVar45 = ((short)uStack_146 < (short)uVar57) * uVar57 |
           ((short)uStack_146 >= (short)uVar57) * uStack_146;
  uVar47 = ((short)uStack_144 < (short)uVar55) * uVar55 |
           ((short)uStack_144 >= (short)uVar55) * uStack_144;
  uVar49 = ((short)uStack_142 < (short)uVar53) * uVar53 |
           ((short)uStack_142 >= (short)uVar53) * uStack_142;
  uVar51 = ((short)uStack_140 < (short)uVar51) * uVar51 |
           ((short)uStack_140 >= (short)uVar51) * uStack_140;
  uVar53 = ((short)uStack_13e < (short)uVar54) * uVar54 |
           ((short)uStack_13e >= (short)uVar54) * uStack_13e;
  uVar55 = ((short)uStack_13c < (short)uVar56) * uVar56 |
           ((short)uStack_13c >= (short)uVar56) * uStack_13c;
  uVar57 = ((short)uStack_13a < (short)uVar58) * uVar58 |
           ((short)uStack_13a >= (short)uVar58) * uStack_13a;
  auVar26 = paddsw(auVar7,local_108);
  auVar23 = pmulhw(auVar26,local_118);
  auVar27._0_2_ = auVar23._0_2_ + auVar26._0_2_;
  auVar27._2_2_ = auVar23._2_2_ + auVar26._2_2_;
  auVar27._4_2_ = auVar23._4_2_ + auVar26._4_2_;
  auVar27._6_2_ = auVar23._6_2_ + auVar26._6_2_;
  auVar27._8_2_ = auVar23._8_2_ + auVar26._8_2_;
  auVar27._10_2_ = auVar23._10_2_ + auVar26._10_2_;
  auVar27._12_2_ = auVar23._12_2_ + auVar26._12_2_;
  auVar27._14_2_ = auVar23._14_2_ + auVar26._14_2_;
  auVar23 = pmulhw(auVar27,local_128);
  auVar109 = paddsw(auVar4,local_108);
  auVar26 = pmulhw(auVar109,local_118);
  auVar42._0_2_ = auVar26._0_2_ + auVar109._0_2_;
  auVar42._2_2_ = auVar26._2_2_ + auVar109._2_2_;
  auVar42._4_2_ = auVar26._4_2_ + auVar109._4_2_;
  auVar42._6_2_ = auVar26._6_2_ + auVar109._6_2_;
  auVar42._8_2_ = auVar26._8_2_ + auVar109._8_2_;
  auVar42._10_2_ = auVar26._10_2_ + auVar109._10_2_;
  auVar42._12_2_ = auVar26._12_2_ + auVar109._12_2_;
  auVar42._14_2_ = auVar26._14_2_ + auVar109._14_2_;
  auVar26 = pmulhw(auVar42,local_128);
  auVar23 = auVar23 ^ auVar24;
  auVar28._0_2_ = auVar23._0_2_ - auVar24._0_2_;
  auVar28._2_2_ = auVar23._2_2_ - auVar24._2_2_;
  auVar28._4_2_ = auVar23._4_2_ - auVar24._4_2_;
  auVar28._6_2_ = auVar23._6_2_ - auVar24._6_2_;
  auVar28._8_2_ = auVar23._8_2_ - auVar24._8_2_;
  auVar28._10_2_ = auVar23._10_2_ - auVar24._10_2_;
  auVar28._12_2_ = auVar23._12_2_ - auVar24._12_2_;
  auVar28._14_2_ = auVar23._14_2_ - auVar24._14_2_;
  auVar26 = auVar26 ^ auVar111;
  auVar43._0_2_ = auVar26._0_2_ - auVar111._0_2_;
  auVar43._2_2_ = auVar26._2_2_ - auVar111._2_2_;
  auVar43._4_2_ = auVar26._4_2_ - auVar111._4_2_;
  auVar43._6_2_ = auVar26._6_2_ - auVar111._6_2_;
  auVar43._8_2_ = auVar26._8_2_ - auVar111._8_2_;
  auVar43._10_2_ = auVar26._10_2_ - auVar111._10_2_;
  auVar43._12_2_ = auVar26._12_2_ - auVar111._12_2_;
  auVar43._14_2_ = auVar26._14_2_ - auVar111._14_2_;
  _local_98 = (__m128i)(auVar28 & auVar89);
  _local_a8 = (__m128i)(auVar43 & auVar64);
  auVar23 = psraw((undefined1  [16])_local_98,0xf);
  auVar93._0_12_ = local_98._0_12_;
  auVar93._12_2_ = local_98._6_2_;
  auVar93._14_2_ = auVar23._6_2_;
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._0_10_ = local_98._0_10_;
  auVar92._10_2_ = auVar23._4_2_;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._0_8_ = local_98._0_8_;
  auVar91._8_2_ = local_98._4_2_;
  auVar90._8_8_ = auVar91._8_8_;
  auVar90._6_2_ = auVar23._2_2_;
  auVar90._4_2_ = local_98._2_2_;
  auVar90._0_2_ = local_98._0_2_;
  auVar90._2_2_ = auVar23._0_2_;
  *(undefined1 (*) [16])(qcoeff_ptr + lVar2) = auVar90;
  ptVar1 = qcoeff_ptr + lVar2 + 4;
  *(short *)ptVar1 = local_98._8_2_;
  *(short *)((long)ptVar1 + 2) = auVar23._8_2_;
  *(short *)(ptVar1 + 1) = local_98._10_2_;
  *(short *)((long)ptVar1 + 6) = auVar23._10_2_;
  *(short *)(ptVar1 + 2) = local_98._12_2_;
  *(short *)((long)ptVar1 + 10) = auVar23._12_2_;
  *(short *)(ptVar1 + 3) = local_98._14_2_;
  *(short *)((long)ptVar1 + 0xe) = auVar23._14_2_;
  auVar23 = psraw((undefined1  [16])_local_a8,0xf);
  auVar97._0_12_ = local_a8._0_12_;
  auVar97._12_2_ = local_a8._6_2_;
  auVar97._14_2_ = auVar23._6_2_;
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._0_10_ = local_a8._0_10_;
  auVar96._10_2_ = auVar23._4_2_;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._0_8_ = local_a8._0_8_;
  auVar95._8_2_ = local_a8._4_2_;
  auVar94._8_8_ = auVar95._8_8_;
  auVar94._6_2_ = auVar23._2_2_;
  auVar94._4_2_ = local_a8._2_2_;
  auVar94._0_2_ = local_a8._0_2_;
  auVar94._2_2_ = auVar23._0_2_;
  *(undefined1 (*) [16])(qcoeff_ptr + lVar2 + 8) = auVar94;
  ptVar1 = qcoeff_ptr + lVar2 + 0xc;
  *(short *)ptVar1 = local_a8._8_2_;
  *(short *)((long)ptVar1 + 2) = auVar23._8_2_;
  *(short *)(ptVar1 + 1) = local_a8._10_2_;
  *(short *)((long)ptVar1 + 6) = auVar23._10_2_;
  *(short *)(ptVar1 + 2) = local_a8._12_2_;
  *(short *)((long)ptVar1 + 10) = auVar23._12_2_;
  *(short *)(ptVar1 + 3) = local_a8._14_2_;
  *(short *)((long)ptVar1 + 0xe) = auVar23._14_2_;
  sVar33 = local_98._2_2_ * local_138._2_2_;
  uVar17 = CONCAT22(sVar33,auVar90._0_2_ * local_138._0_2_);
  auVar21._10_2_ = local_98._4_2_ * local_138._4_2_;
  uVar19 = CONCAT24(auVar21._10_2_,uVar17);
  auVar23._12_2_ = local_98._6_2_ * local_138._6_2_;
  uVar20 = CONCAT26(auVar23._12_2_,uVar19);
  auVar23._14_2_ = local_98._8_2_ * local_138._8_2_;
  auVar22._0_10_ = CONCAT28(auVar23._14_2_,uVar20);
  auVar22._10_2_ = local_98._10_2_ * local_138._10_2_;
  auVar29._12_2_ = local_98._12_2_ * local_138._12_2_;
  auVar29._0_12_ = auVar22;
  auVar29._14_2_ = local_98._14_2_ * local_138._14_2_;
  sVar52 = local_a8._2_2_ * local_138._2_2_;
  uVar37 = CONCAT22(sVar52,auVar94._0_2_ * local_138._0_2_);
  auVar39._10_2_ = local_a8._4_2_ * local_138._4_2_;
  uVar18 = CONCAT24(auVar39._10_2_,uVar37);
  auVar24._12_2_ = local_a8._6_2_ * local_138._6_2_;
  uVar38 = CONCAT26(auVar24._12_2_,uVar18);
  auVar24._14_2_ = local_a8._8_2_ * local_138._8_2_;
  auVar40._0_10_ = CONCAT28(auVar24._14_2_,uVar38);
  auVar40._10_2_ = local_a8._10_2_ * local_138._10_2_;
  auVar44._12_2_ = local_a8._12_2_ * local_138._12_2_;
  auVar44._0_12_ = auVar40;
  auVar44._14_2_ = local_a8._14_2_ * local_138._14_2_;
  auVar26 = psraw(auVar29,0xf);
  auVar103._12_2_ = auVar23._12_2_;
  auVar103._0_12_ = auVar22;
  auVar103._14_2_ = auVar26._6_2_;
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._10_2_ = auVar26._4_2_;
  auVar102._0_10_ = auVar22._0_10_;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._8_2_ = auVar21._10_2_;
  auVar101._0_8_ = uVar20;
  auVar100._8_8_ = auVar101._8_8_;
  auVar100._6_2_ = auVar26._2_2_;
  auVar100._0_6_ = uVar19;
  auVar99._6_10_ = auVar100._6_10_;
  auVar99._4_2_ = sVar33;
  auVar99._0_4_ = uVar17;
  auVar98._4_12_ = auVar99._4_12_;
  auVar98._2_2_ = auVar26._0_2_;
  auVar98._0_2_ = auVar90._0_2_ * local_138._0_2_;
  *(undefined1 (*) [16])(dqcoeff_ptr + lVar2) = auVar98;
  ptVar1 = dqcoeff_ptr + lVar2 + 4;
  *(short *)ptVar1 = auVar23._14_2_;
  *(short *)((long)ptVar1 + 2) = auVar26._8_2_;
  *(short *)(ptVar1 + 1) = auVar22._10_2_;
  *(short *)((long)ptVar1 + 6) = auVar26._10_2_;
  *(short *)(ptVar1 + 2) = auVar29._12_2_;
  *(short *)((long)ptVar1 + 10) = auVar26._12_2_;
  *(short *)(ptVar1 + 3) = auVar29._14_2_;
  *(short *)((long)ptVar1 + 0xe) = auVar26._14_2_;
  auVar23 = psraw(auVar44,0xf);
  auVar70._12_2_ = auVar24._12_2_;
  auVar70._0_12_ = auVar40;
  auVar70._14_2_ = auVar23._6_2_;
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._10_2_ = auVar23._4_2_;
  auVar69._0_10_ = auVar40._0_10_;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = auVar39._10_2_;
  auVar68._0_8_ = uVar38;
  auVar67._8_8_ = auVar68._8_8_;
  auVar67._6_2_ = auVar23._2_2_;
  auVar67._0_6_ = uVar18;
  auVar66._6_10_ = auVar67._6_10_;
  auVar66._4_2_ = sVar52;
  auVar66._0_4_ = uVar37;
  auVar65._4_12_ = auVar66._4_12_;
  auVar65._2_2_ = auVar23._0_2_;
  auVar65._0_2_ = auVar94._0_2_ * local_138._0_2_;
  *(undefined1 (*) [16])(dqcoeff_ptr + lVar2 + 8) = auVar65;
  ptVar1 = dqcoeff_ptr + lVar2 + 0xc;
  *(short *)ptVar1 = auVar24._14_2_;
  *(short *)((long)ptVar1 + 2) = auVar23._8_2_;
  *(short *)(ptVar1 + 1) = auVar40._10_2_;
  *(short *)((long)ptVar1 + 6) = auVar23._10_2_;
  *(short *)(ptVar1 + 2) = auVar44._12_2_;
  *(short *)((long)ptVar1 + 10) = auVar23._12_2_;
  *(short *)(ptVar1 + 3) = auVar44._14_2_;
  *(short *)((long)ptVar1 + 0xe) = auVar23._14_2_;
  local_14c = 0;
  goto LAB_002bf984;
}

Assistant:

void aom_quantize_b_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  load_b_values(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  // Poor man's abs().
  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff(&qcoeff0, round, quant, shift);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);

    calculate_qcoeff(&qcoeff1, round, quant, shift);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr);
    store_coefficients(coeff1, dqcoeff_ptr + 8);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff(&qcoeff0, round, quant, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr + index);
    store_coefficients(coeff1, dqcoeff_ptr + index + 8);

    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}